

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_Width_Test::TestBody(FormatterTest_Width_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  string gtest_expected_message;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  char format_str [256];
  undefined1 local_458 [32];
  internal local_438 [8];
  _Alloc_hider local_430;
  AssertionResult local_428;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  undefined1 *local_408;
  long local_400;
  undefined8 local_3f8;
  undefined1 local_3f0 [504];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined8 local_178 [2];
  undefined8 local_168 [2];
  undefined8 local_158 [2];
  undefined8 local_148 [2];
  char local_138 [264];
  
  safe_sprintf<256ul>((char (*) [256])local_138,"{0:%u",0xffffffff);
  increment(local_138 + 3);
  testing::AssertionSuccess();
  pAVar1 = (AssertHelperData *)(local_458 + 0x10);
  if (local_428.success_ == true) {
    local_458._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_178[0] = 0;
      local_400 = 0;
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_3f8 = 500;
      format_str_00.size_ = sVar3;
      format_str_00.data_ = local_138;
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_178;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                    ::TYPES;
      local_408 = local_3f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_410,format_str_00,args,(locale_ref)0x0);
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,local_408,local_408 + local_400);
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_408 != local_3f0) {
        operator_delete(local_408);
      }
      if (local_198[0] != local_188) {
        operator_delete(local_198[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_428,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
      operator_delete((void *)local_458._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_410);
  if ((undefined8 *)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_458,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x446,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
  if (((local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_410.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_410.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_428.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  sVar3 = strlen(local_138);
  (local_138 + sVar3)[0] = '}';
  (local_138 + sVar3)[1] = '\0';
  testing::AssertionSuccess();
  if (local_428.success_ == true) {
    local_458._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_168[0] = 0;
      local_400 = 0;
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_3f8 = 500;
      format_str_01.size_ = sVar3;
      format_str_01.data_ = local_138;
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_168;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_408 = local_3f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_410,format_str_01,args_00,(locale_ref)0x0);
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,local_408,local_408 + local_400);
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_408 != local_3f0) {
        operator_delete(local_408);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_428,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
      operator_delete((void *)local_458._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_410);
  if ((undefined8 *)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_458,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x44a,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
  if (((local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_410.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_410.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_428.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_138,"{0:%u",0x80000000);
  testing::AssertionSuccess();
  if (local_428.success_ == true) {
    local_458._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_158[0] = 0;
      local_400 = 0;
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_3f8 = 500;
      format_str_02.size_ = sVar3;
      format_str_02.data_ = local_138;
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_158;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_408 = local_3f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_410,format_str_02,args_01,(locale_ref)0x0);
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,local_408,local_408 + local_400);
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_408 != local_3f0) {
        operator_delete(local_408);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_428,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
      operator_delete((void *)local_458._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_410);
  if ((undefined8 *)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_458,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x44d,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
  if (((local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_410.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_410.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_428.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_138,"{0:%u}",0x80000000);
  testing::AssertionSuccess();
  if (local_428.success_ == true) {
    local_458._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_148[0] = 0;
      local_400 = 0;
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_3f8 = 500;
      format_str_03.size_ = sVar3;
      format_str_03.data_ = local_138;
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_148;
      args_02.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_408 = local_3f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_410,format_str_03,args_02,(locale_ref)0x0);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,local_408,local_408 + local_400);
      local_410.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_408 != local_3f0) {
        operator_delete(local_408);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_428,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
      operator_delete((void *)local_458._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_410);
  if ((undefined8 *)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_428.message_.ptr_._2_6_,local_428.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_458,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x44f,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
  if (((local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_410.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_410.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_428.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_428.success_ = true;
  local_428._1_7_ = 0xffffff;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_04.size_ = 5;
  format_str_04.data_ = "{0:4}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_04,args_03,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_438,"\" -42\"","format(\"{0:4}\", -42)",(char (*) [5])0x23b7d1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x450,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_05.size_ = 5;
  format_str_05.data_ = "{0:5}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_05,args_04,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_438,"\"   42\"","format(\"{0:5}\", 42u)",(char (*) [6])0x242e5c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x451,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0xffffffffffffff;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_06.size_ = 5;
  format_str_06.data_ = "{0:6}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_06,args_05,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_438,"\"   -42\"","format(\"{0:6}\", -42l)",(char (*) [7])"   -42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x452,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_07.size_ = 5;
  format_str_07.data_ = "{0:7}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_07,args_06,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_438,"\"     42\"","format(\"{0:7}\", 42ul)",(char (*) [8])0x242e5a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x453,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0xffffffffffffff;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_08.size_ = 5;
  format_str_08.data_ = "{0:6}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_08,args_07,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_438,"\"   -42\"","format(\"{0:6}\", -42ll)",(char (*) [7])"   -42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x454,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_09.size_ = 5;
  format_str_09.data_ = "{0:7}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_09,args_08,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_438,"\"     42\"","format(\"{0:7}\", 42ull)",(char (*) [8])0x242e5a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x455,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0xbff3ae147ae147;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_10.size_ = 5;
  format_str_10.data_ = "{0:8}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_10,args_09,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_438,"\"   -1.23\"","format(\"{0:8}\", -1.23)",(char (*) [9])0x23b87d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x456,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0x9d70a3d70a3d70;
  local_428.message_.ptr_._0_2_ = 0xbfff;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_11.size_ = 5;
  format_str_11.data_ = "{0:9}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_11,args_10,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            (local_438,"\"    -1.23\"","format(\"{0:9}\", -1.23l)",(char (*) [10])"    -1.23",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x457,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0xca;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_12.size_ = 6;
  format_str_12.data_ = "{0:10}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_12,args_11,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_438,"\"    0xcafe\"","format(\"{0:10}\", reinterpret_cast<void*>(0xcafe))",
             (char (*) [11])"    0xcafe",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x458,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428.success_ = true;
  local_428._1_7_ = 0;
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_13.size_ = 6;
  format_str_13.data_ = "{0:11}";
  args_12.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_12.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_13,args_12,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            (local_438,"\"x          \"","format(\"{0:11}\", \'x\')",(char (*) [12])"x          ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x459,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_428._0_8_ = "str";
  local_400 = 0;
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_3f8 = 500;
  format_str_14.size_ = 6;
  format_str_14.data_ = "{0:12}";
  args_13.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_428;
  args_13.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
       ::TYPES;
  local_408 = local_3f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_410,format_str_14,args_13,(locale_ref)0x0);
  local_458._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,local_408,local_408 + local_400);
  local_410.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_408 != local_3f0) {
    operator_delete(local_408);
  }
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_438,"\"str         \"","format(\"{0:12}\", \"str\")",
             (char (*) [13])"str         ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  if ((AssertHelperData *)local_458._0_8_ != pAVar1) {
    operator_delete((void *)local_458._0_8_);
  }
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_430._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_430._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x45a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
    if (((local_410.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_410.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_410.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, Width) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:%u", UINT_MAX);
  increment(format_str + 3);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  safe_sprintf(format_str, "{0:%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  safe_sprintf(format_str, "{0:%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  EXPECT_EQ(" -42", format("{0:4}", -42));
  EXPECT_EQ("   42", format("{0:5}", 42u));
  EXPECT_EQ("   -42", format("{0:6}", -42l));
  EXPECT_EQ("     42", format("{0:7}", 42ul));
  EXPECT_EQ("   -42", format("{0:6}", -42ll));
  EXPECT_EQ("     42", format("{0:7}", 42ull));
  EXPECT_EQ("   -1.23", format("{0:8}", -1.23));
  EXPECT_EQ("    -1.23", format("{0:9}", -1.23l));
  EXPECT_EQ("    0xcafe", format("{0:10}", reinterpret_cast<void*>(0xcafe)));
  EXPECT_EQ("x          ", format("{0:11}", 'x'));
  EXPECT_EQ("str         ", format("{0:12}", "str"));
}